

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5ParseNearsetFree(Fts5ExprNearset *pNear)

{
  long in_RDI;
  Fts5ExprPhrase *unaff_retaddr;
  int i;
  undefined4 local_c;
  
  if (in_RDI != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x10); local_c = local_c + 1) {
      fts5ExprPhraseFree(unaff_retaddr);
    }
    sqlite3_free((void *)0x26b3fe);
    sqlite3_free((void *)0x26b408);
  }
  return;
}

Assistant:

static void sqlite3Fts5ParseNearsetFree(Fts5ExprNearset *pNear){
  if( pNear ){
    int i;
    for(i=0; i<pNear->nPhrase; i++){
      fts5ExprPhraseFree(pNear->apPhrase[i]);
    }
    sqlite3_free(pNear->pColset);
    sqlite3_free(pNear);
  }
}